

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transmitter_PDU::SetAntennaPattern(Transmitter_PDU *this,KOCTET *AP,KUINT16 Length)

{
  size_type sVar1;
  value_type local_1f;
  byte local_1e;
  byte local_1d;
  ushort local_1c;
  KUINT16 local_1a;
  KUINT8 i_1;
  KUINT8 ui8PaddingNeeded;
  KUINT16 i;
  KOCTET *pKStack_18;
  KUINT16 Length_local;
  KOCTET *AP_local;
  Transmitter_PDU *this_local;
  
  local_1a = Length;
  pKStack_18 = AP;
  AP_local = (KOCTET *)this;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vAntennaPattern);
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength -
       (short)sVar1;
  std::vector<char,_std::allocator<char>_>::clear(&this->m_vAntennaPattern);
  for (local_1c = 0; local_1c < local_1a; local_1c = local_1c + 1) {
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vAntennaPattern,pKStack_18);
    pKStack_18 = pKStack_18 + 1;
  }
  local_1d = (byte)((ulong)local_1a % 8);
  for (local_1e = 0; local_1e < local_1d; local_1e = local_1e + 1) {
    local_1f = '\0';
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vAntennaPattern,&local_1f);
  }
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vAntennaPattern);
  this->m_ui16AntennaPatternLength = (KUINT16)sVar1;
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength +
       this->m_ui16AntennaPatternLength;
  return;
}

Assistant:

void Transmitter_PDU::SetAntennaPattern( const KOCTET * AP, KUINT16 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength -= m_vAntennaPattern.size();
    m_vAntennaPattern.clear();

    // Copy data into the vector
    for( KUINT16 i = 0; i < Length; ++i, ++AP )
    {
        m_vAntennaPattern.push_back( *AP );
    }

    // Check if we need to add any padding, the length should be a
    // multiple of 8.
    KUINT8 ui8PaddingNeeded = Length % 8;

    // Add the padding, if needed.
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vAntennaPattern.push_back( 0 );
    }

    // Update length
    m_ui16AntennaPatternLength = m_vAntennaPattern.size();
    m_ui16PDULength += m_ui16AntennaPatternLength;
}